

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall CVmObjBigNum::compare_to(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *val)

{
  int iVar1;
  vm_val_t val2;
  vm_val_t local_18;
  
  local_18.typ = val->typ;
  local_18._4_4_ = *(undefined4 *)&val->field_0x4;
  local_18.val = val->val;
  iVar1 = cvt_to_bignum(this,self,&local_18);
  if (iVar1 != 0) {
    iVar1 = compare_ext((this->super_CVmObject).ext_,
                        *(char **)((long)&G_obj_table_X.pages_[local_18.val.obj >> 0xc]
                                          [local_18.val.obj & 0xfff].ptr_ + 8));
    return iVar1;
  }
  err_throw(0x7d9);
}

Assistant:

int CVmObjBigNum::compare_to(VMG_ vm_obj_id_t self,
                             const vm_val_t *val) const
{
    vm_val_t val2;

    /* convert it */
    val2 = *val;
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* this type is not convertible to BigNumber - it's not comparable */
        err_throw(VMERR_INVALID_COMPARISON);
    }

    /* compare the values */
    return compare_ext(ext_, get_objid_ext(vmg_ val2.val.obj));
}